

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::statementList(Parse *this)

{
  int iVar1;
  int iVar2;
  
  iVar2 = this->curIndex;
  while( true ) {
    iVar1 = statement(this);
    if (iVar1 == 0) break;
    iVar2 = this->curIndex;
  }
  this->curIndex = iVar2;
  return 1;
}

Assistant:

int Parse::statementList() {
    int index = curIndex;
    if (statement()) {
        statementList();
        return 1;
    }
    curIndex = index;
    return 1;
}